

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantArray.h
# Opt level: O1

void __thiscall
flow::ConstantArray::ConstantArray
          (ConstantArray *this,vector<flow::Constant_*,_std::allocator<flow::Constant_*>_> *elements
          ,string *name)

{
  LiteralType ty;
  
  (this->super_Constant).super_Value._vptr_Value = (_func_int **)&PTR__ConstantArray_001960e0;
  ty = makeArrayType(this,((*(elements->
                             super__Vector_base<flow::Constant_*,_std::allocator<flow::Constant_*>_>
                             )._M_impl.super__Vector_impl_data._M_start)->super_Value).type_);
  Value::Value((Value *)this,ty,name);
  (this->super_Constant).super_Value._vptr_Value = (_func_int **)&PTR__ConstantArray_001960e0;
  std::vector<flow::Constant_*,_std::allocator<flow::Constant_*>_>::vector
            (&this->elements_,elements);
  return;
}

Assistant:

ConstantArray(const std::vector<Constant*>& elements,
                const std::string& name = "")
      : Constant(makeArrayType(elements.front()->type()), name),
        elements_(elements) {}